

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::keypoint_localization(Sift *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  size_type sVar14;
  reference pvVar15;
  reference pvVar16;
  const_reference pvVar17;
  ImageBase *pIVar18;
  element_type *peVar19;
  float *pfVar20;
  ostream *poVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  shared_ptr<core::Image<float>const> *local_3e8;
  bool local_3ca;
  bool local_3c9;
  bool local_3c2;
  bool local_3c1;
  float score_thres;
  float hessian_score;
  float hessian_det;
  float hessian_trace;
  float val;
  int dy;
  int dx;
  Vec3f delta;
  float local_134;
  undefined1 local_130 [8];
  Vec3f b;
  Matrix3f H_inv;
  float detH;
  Matrix3f H;
  size_t px;
  int j;
  float Dys;
  float Dxs;
  float Dxy;
  float Dss;
  float Dyy;
  float Dxx;
  float Ds;
  float Dy;
  float Dx;
  float delta_s;
  float delta_y;
  float delta_x;
  int is;
  int iy;
  int ix;
  int h;
  shared_ptr<core::Image<float>const> local_78 [4];
  int w;
  ConstPtr dogs [3];
  int sample;
  Octave *oct;
  Keypoint kp;
  ulong local_20;
  size_t i;
  int num_keypoints;
  int num_singular;
  Sift *this_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  local_20 = 0;
  do {
    sVar14 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::size
                       (&this->keypoints);
    if (sVar14 <= local_20) {
      std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::resize
                (&this->keypoints,(long)(int)i);
      if ((((this->options).debug_output & 1U) != 0) && (0 < i._4_4_)) {
        poVar21 = std::operator<<((ostream *)&std::cout,"SIFT: Warning: ");
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,i._4_4_);
        poVar21 = std::operator<<(poVar21," singular matrices detected!");
        std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
      }
      return;
    }
    pvVar15 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::
              operator[](&this->keypoints,local_20);
    uVar7 = pvVar15->octave;
    uVar8 = pvVar15->sample;
    uVar9 = pvVar15->x;
    uVar10 = pvVar15->y;
    pvVar16 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
              operator[](&this->octaves,(long)(uVar7 - (this->options).min_octave));
    dogs[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = (int)(float)uVar8;
    pvVar17 = std::
              vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ::operator[](&pvVar16->dog,
                           (long)dogs[2].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>(local_78,pvVar17);
    pvVar17 = std::
              vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ::operator[](&pvVar16->dog,
                           (long)(dogs[2].
                                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_ + 1));
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)
               &dogs[0].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pvVar17);
    pvVar17 = std::
              vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ::operator[](&pvVar16->dog,
                           (long)(dogs[2].
                                  super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_ + 2));
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)
               &dogs[1].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pvVar17);
    pIVar18 = (ImageBase *)
              std::
              __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_78);
    uVar11 = core::ImageBase::width(pIVar18);
    pIVar18 = (ImageBase *)
              std::
              __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_78);
    iVar12 = core::ImageBase::height(pIVar18);
    is = (int)(float)uVar9;
    delta_x = (float)(int)(float)uVar10;
    for (px._0_4_ = 0; iVar13 = (int)pIVar18, (int)px < 5; px._0_4_ = (int)px + 1) {
      iVar13 = (int)delta_x * uVar11 + is;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + 1);
      fVar1 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + -1);
      fVar24 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + uVar11);
      fVar25 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 - uVar11);
      fVar26 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[1].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      fVar27 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      fVar28 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + 1);
      fVar2 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + -1);
      fVar3 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      Dss = (fVar2 + fVar3) - (*pfVar20 + *pfVar20);
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + uVar11);
      fVar2 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 - uVar11);
      fVar3 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      Dxy = (fVar2 + fVar3) - (*pfVar20 + *pfVar20);
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[1].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      fVar2 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      fVar3 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13);
      fVar4 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + 1 + uVar11);
      fVar23 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,~uVar11 + iVar13);
      fVar5 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + -1 + uVar11);
      fVar6 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[0].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,(iVar13 - uVar11) + 1);
      Dys = (((fVar23 + fVar5) - fVar6) - *pfVar20) * 0.25;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[1].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + 1);
      fVar23 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + -1);
      fVar5 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[1].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + -1);
      fVar6 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + 1);
      fVar22 = (((fVar23 + fVar5) - fVar6) - *pfVar20) * 0.25;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[1].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + uVar11);
      fVar23 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 - uVar11);
      fVar5 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&dogs[1].
                                 super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 - uVar11);
      fVar6 = *pfVar20;
      peVar19 = std::
                __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_78);
      pfVar20 = core::Image<float>::at(peVar19,iVar13 + uVar11);
      fVar23 = (((fVar23 + fVar5) - fVar6) - *pfVar20) * 0.25;
      math::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)(H_inv.m + 8));
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),0);
      *pfVar20 = Dss;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),1);
      *pfVar20 = Dys;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),2);
      *pfVar20 = fVar22;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),3);
      *pfVar20 = Dys;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),4);
      *pfVar20 = Dxy;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),5);
      *pfVar20 = fVar23;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),6);
      *pfVar20 = fVar22;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),7);
      *pfVar20 = fVar23;
      pfVar20 = math::Matrix<float,_3,_3>::operator[]((Matrix<float,_3,_3> *)(H_inv.m + 8),8);
      *pfVar20 = (fVar2 + fVar3) - (fVar4 + fVar4);
      pfVar20 = H_inv.m + 8;
      H_inv.m[7] = math::matrix_determinant<float>((Matrix<float,_3,_3> *)pfVar20);
      iVar13 = (int)pfVar20;
      if ((-1e-15 <= H_inv.m[7]) && (H_inv.m[7] <= 1e-15)) {
        i._4_4_ = i._4_4_ + 1;
        Dy = 0.0;
        Dx = 0.0;
        delta_s = 0.0;
        break;
      }
      math::matrix_inverse<float>
                ((Matrix<float,_3,_3> *)(b.v + 1),(Matrix<float,_3,_3> *)(H_inv.m + 8),H_inv.m + 7);
      local_134 = -((fVar1 - fVar24) * 0.5);
      delta.v[2] = -((fVar25 - fVar26) * 0.5);
      delta.v[1] = -((fVar27 - fVar28) * 0.5);
      math::Vector<float,_3>::Vector
                ((Vector<float,_3> *)local_130,&local_134,delta.v + 2,delta.v + 1);
      math::Vector<float,_3>::Vector((Vector<float,_3> *)&dy);
      pfVar20 = math::Vector<float,_3>::operator[]((Vector<float,_3> *)&dy,0);
      delta_s = *pfVar20;
      pfVar20 = math::Vector<float,_3>::operator[]((Vector<float,_3> *)&dy,1);
      Dx = *pfVar20;
      pIVar18 = (ImageBase *)&dy;
      pfVar20 = math::Vector<float,_3>::operator[]((Vector<float,_3> *)pIVar18,2);
      iVar13 = (int)pIVar18;
      Dy = *pfVar20;
      local_3c1 = 0.6 < delta_s && is < (int)(uVar11 - 2);
      local_3c2 = delta_s < -0.6 && 1 < is;
      local_3c9 = 0.6 < Dx && (int)delta_x < iVar12 + -2;
      local_3ca = Dx < -0.6 && 1 < (int)delta_x;
      if (((uint)local_3c1 - (uint)local_3c2 == 0) && ((uint)local_3c9 - (uint)local_3ca == 0))
      break;
      is = ((uint)local_3c1 - (uint)local_3c2) + is;
      delta_x = (float)(((uint)local_3c9 - (uint)local_3ca) + (int)delta_x);
    }
    fVar24 = ((Dss + Dxy) * (Dss + Dxy)) / (Dss * Dxy - Dys * Dys);
    fVar1 = (this->options).edge_ratio_threshold;
    fVar25 = fVar1 + 1.0;
    fVar26 = (float)is + delta_s;
    fVar27 = (float)(int)delta_x + Dx;
    fVar28 = (float)(int)(float)uVar8 + Dy;
    oct = (Octave *)CONCAT44(fVar28,uVar7);
    std::abs(iVar13);
    if ((((((this->options).contrast_threshold <= extraout_XMM0_Da) && (0.0 <= fVar24)) &&
         (fVar24 <= (fVar25 * fVar25) / fVar1)) &&
        ((((std::abs(iVar13), extraout_XMM0_Da_00 <= 1.5 &&
           (std::abs(iVar13), extraout_XMM0_Da_01 <= 1.5)) &&
          ((std::abs(iVar13), extraout_XMM0_Da_02 <= 1.0 &&
           ((-1.0 <= fVar28 && (fVar28 <= (float)(this->options).num_samples_per_octave)))))) &&
         (0.0 <= fVar26)))) &&
       (((fVar26 <= (float)(int)(uVar11 - 1) && (0.0 <= fVar27)) && (fVar27 <= (float)(iVar12 + -1))
        ))) {
      pvVar15 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::
                operator[](&this->keypoints,(long)(int)i);
      *(Octave **)pvVar15 = oct;
      pvVar15->x = fVar26;
      pvVar15->y = fVar27;
      i._0_4_ = (int)i + 1;
    }
    local_3e8 = (shared_ptr<core::Image<float>const> *)
                &dogs[2].super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    do {
      local_3e8 = local_3e8 + -0x10;
      std::shared_ptr<const_core::Image<float>_>::~shared_ptr
                ((shared_ptr<const_core::Image<float>_> *)local_3e8);
    } while (local_3e8 != local_78);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void
Sift::keypoint_localization (void)
{
    /*
     * Iterate over all keypoints, accurately localize minima and maxima
     * in the DoG function by fitting a quadratic Taylor polynomial
     * around the keypoint.
     */

    int num_singular = 0;
    int num_keypoints = 0; // Write iterator
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        /* Copy keypoint. */
        Keypoint kp(this->keypoints[i]);

        /* Get corresponding octave and DoG images. */
        Octave const& oct(this->octaves[kp.octave - this->options.min_octave]);
        int sample = static_cast<int>(kp.sample);
        core::FloatImage::ConstPtr dogs[3] = { oct.dog[sample + 0], oct.dog[sample + 1], oct.dog[sample + 2] };

        /* Shorthand for image width and height. */
        int const w = dogs[0]->width();
        int const h = dogs[0]->height();
        /* The integer and floating point location of the keypoints. */
        int ix = static_cast<int>(kp.x);
        int iy = static_cast<int>(kp.y);
        int is = static_cast<int>(kp.sample);
        float delta_x, delta_y, delta_s;
        /* The first and second order derivatives. */
        float Dx, Dy, Ds;
        float Dxx, Dyy, Dss;
        float Dxy, Dxs, Dys;

        /*
         * Locate the keypoint using second order Taylor approximation.
         * The procedure might get iterated around a neighboring pixel if
         * the accurate keypoint is off by >0.6 from the center pixel.
         */
#       define AT(S,OFF) (dogs[S]->at(px + OFF))
        for (int j = 0; j < 5; ++j)
        {
            std::size_t px = iy * w + ix;

            /* Compute first and second derivatives. */
            Dx = (AT(1,1) - AT(1,-1)) * 0.5f;
            Dy = (AT(1,w) - AT(1,-w)) * 0.5f;
            Ds = (AT(2,0) - AT(0,0))  * 0.5f;

            Dxx = AT(1,1) + AT(1,-1) - 2.0f * AT(1,0);
            Dyy = AT(1,w) + AT(1,-w) - 2.0f * AT(1,0);
            Dss = AT(2,0) + AT(0,0)  - 2.0f * AT(1,0);

            Dxy = (AT(1,1+w) + AT(1,-1-w) - AT(1,-1+w) - AT(1,1-w)) * 0.25f;
            Dxs = (AT(2,1)   + AT(0,-1)   - AT(2,-1)   - AT(0,1))   * 0.25f;
            Dys = (AT(2,w)   + AT(0,-w)   - AT(2,-w)   - AT(0,w))   * 0.25f;

            /* Setup the Hessian matrix. */
            math::Matrix3f H;
            /****************************task-1-0  构造Hessian矩阵 ******************************/
            /*
             * 参考第32页slide的Hessian矩阵构造方式填充H矩阵，其中dx=dy=d_sigma=1, 其中A矩阵按照行顺序存储，即
             * H=[H[0], H[1], H[2]]
             *   [H[3], H[4], H[5]]
             *   [H[6], H[7], H[8]]
             */

            /**********************************************************************************/
            H[0] = Dxx; H[1] = Dxy; H[2] = Dxs;
            H[3] = Dxy; H[4] = Dyy; H[5] = Dys;
            H[6] = Dxs; H[7] = Dys; H[8] = Dss;


            /* Compute determinant to detect singular matrix. */
            float detH = math::matrix_determinant(H);
            if (MATH_EPSILON_EQ(detH, 0.0f, 1e-15f))
            {
                num_singular += 1;
                delta_x = delta_y = delta_s = 0.0f; // FIXME: Handle this case?
                break;
            }
            /* Invert the matrix to get the accurate keypoint. */
            math::Matrix3f H_inv = math::matrix_inverse(H, detH);
            math::Vec3f b(-Dx, -Dy, -Ds);


            math::Vec3f delta;
            /****************************task-1-1  求解偏移量deta ******************************/
            /*
             * 参考第30页slide delta_x的求解方式 delta_x = inv(H)*b
             * 请在此处给出delta的表达式
                     /*                  */
                     /*    此处添加代码    */
                     /*                  */
            /**********************************************************************************/


            //math::Vec3f delta = H_inv * b;
            delta_x = delta[0];
            delta_y = delta[1];
            delta_s = delta[2];


            /* Check if accurate location is far away from pixel center. */
            // dx =0 表示|dx|>0.6f
            int dx = (delta_x > 0.6f && ix < w-2) * 1 + (delta_x < -0.6f && ix > 1) * -1;
            int dy = (delta_y > 0.6f && iy < h-2) * 1 + (delta_y < -0.6f && iy > 1) * -1;

            /* If the accurate location is closer to another pixel,
             * repeat localization around the other pixel. */
            if (dx != 0 || dy != 0)
            {
                ix += dx;
                iy += dy;
                continue;
            }
            /* Accurate location looks good. */
            break;
        }




        /* Calcualte function value D(x) at accurate keypoint x. */
        /*****************************task1-2求解极值点处的DoG值val ***************************/
         /*
          * 参考第30页slides的机极值点f(x)的求解公式f(x) = f(x0) + 0.5* delta.dot(D)
          * 其中
          * f(x0)--表示插值点(ix, iy, is) 处的DoG值，可通过dogs[1]->at(ix, iy, 0)获取
          * delta--为上述求得的delta=[delta_x, delta_y, delta_s]
          * D--为一阶导数，表示为(Dx, Dy, Ds)
          * 请给出求解val的代码
          */
        float val = 0.0;
        /*                  */
        /*    此处添加代码    */
        /*                  */
        /************************************************************************************/



        //float val = dogs[1]->at(ix, iy, 0) + 0.5f * (Dx * delta_x + Dy * delta_y + Ds * delta_s);
        /* Calcualte edge response score Tr(H)^2 / Det(H), see Section 4.1. */
         /**************************去除边缘点，参考第33页slide 仔细阅读代码 ****************************/
        float hessian_trace = Dxx + Dyy;
        float hessian_det = Dxx * Dyy - MATH_POW2(Dxy);
        float hessian_score = MATH_POW2(hessian_trace) / hessian_det;
        float score_thres = MATH_POW2(this->options.edge_ratio_threshold + 1.0f)
            / this->options.edge_ratio_threshold;
        /********************************************************************************/

        /*
         * Set accurate final keypoint location.
         */
        kp.x = (float)ix + delta_x;
        kp.y = (float)iy + delta_y;
        kp.sample = (float)is + delta_s;

        /*
         * Discard keypoints with:
         * 1. low contrast (value of DoG function at keypoint),
         * 2. negative hessian determinant (curvatures with different sign),
         *    Note that negative score implies negative determinant.
         * 3. large edge response (large hessian score),
         * 4. unstable keypoint accurate locations,
         * 5. keypoints beyond the scale space boundary.
         */
        if (std::abs(val) < this->options.contrast_threshold
            || hessian_score < 0.0f || hessian_score > score_thres
            || std::abs(delta_x) > 1.5f || std::abs(delta_y) > 1.5f || std::abs(delta_s) > 1.0f
            || kp.sample < -1.0f
            || kp.sample > (float)this->options.num_samples_per_octave
            || kp.x < 0.0f || kp.x > (float)(w - 1)
            || kp.y < 0.0f || kp.y > (float)(h - 1))
        {
            //std::cout << " REJECTED!" << std::endl;
            continue;
        }

        /* Keypoint is accepted, copy to write iter and advance. */
        this->keypoints[num_keypoints] = kp;
        num_keypoints += 1;
    }

    /* Limit vector size to number of accepted keypoints. */
    this->keypoints.resize(num_keypoints);

    if (this->options.debug_output && num_singular > 0)
    {
        std::cout << "SIFT: Warning: " << num_singular
            << " singular matrices detected!" << std::endl;
    }
}